

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-diag.c
# Opt level: O3

void fy_diag_unref(fy_diag *diag)

{
  int iVar1;
  
  if (diag != (fy_diag *)0x0) {
    iVar1 = diag->refs;
    if (iVar1 < 1) {
      __assert_fail("diag->refs > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-diag.c"
                    ,0xc0,"void fy_diag_unref(struct fy_diag *)");
    }
    if (iVar1 == 1) {
      free(diag);
      return;
    }
    diag->refs = iVar1 + -1;
  }
  return;
}

Assistant:

void fy_diag_unref(struct fy_diag *diag) {
    if (!diag)
        return;

    assert(diag->refs > 0);

    if (diag->refs == 1)
        fy_diag_free(diag);
    else
        diag->refs--;
}